

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uarrsort.cpp
# Opt level: O0

void quickSort(char *array,int32_t length,int32_t itemSize,UComparator *cmp,void *context,
              UErrorCode *pErrorCode)

{
  void **local_1d0;
  void *p;
  UAlignedMemory xw [51];
  UErrorCode *pErrorCode_local;
  void *context_local;
  UComparator *cmp_local;
  int32_t itemSize_local;
  int32_t length_local;
  char *array_local;
  
  xw[0x32] = (UAlignedMemory)pErrorCode;
  if (itemSize < 0xc9) {
    local_1d0 = &p;
  }
  else {
    local_1d0 = (void **)uprv_malloc_63((long)(itemSize << 1));
    if (local_1d0 == (void **)0x0) {
      *(undefined4 *)xw[0x32].t3 = 7;
      return;
    }
  }
  subQuickSort(array,0,length,itemSize,cmp,context,local_1d0,
               (void *)((long)local_1d0 + (long)itemSize));
  if (local_1d0 != &p) {
    uprv_free_63(local_1d0);
  }
  return;
}

Assistant:

static void
quickSort(char *array, int32_t length, int32_t itemSize,
            UComparator *cmp, const void *context, UErrorCode *pErrorCode) {
    UAlignedMemory xw[(2*STACK_ITEM_SIZE)/sizeof(UAlignedMemory)+1];
    void *p;

    /* allocate two intermediate item variables (x and w) */
    if(itemSize<=STACK_ITEM_SIZE) {
        p=xw;
    } else {
        p=uprv_malloc(2*itemSize);
        if(p==NULL) {
            *pErrorCode=U_MEMORY_ALLOCATION_ERROR;
            return;
        }
    }

    subQuickSort(array, 0, length, itemSize,
                 cmp, context, p, (char *)p+itemSize);

    if(p!=xw) {
        uprv_free(p);
    }
}